

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonestack.cpp
# Opt level: O0

void __thiscall
asmjit::_abi_1_10::ZoneStackBase::_cleanupBlock
          (ZoneStackBase *this,uint32_t side,size_t middleIndex)

{
  bool bVar1;
  long in_RDX;
  uint in_ESI;
  size_t in_RDI;
  Block *prev;
  Block *block;
  char *in_stack_000003c0;
  int in_stack_000003cc;
  char *in_stack_000003d0;
  Slot *p;
  ZoneAllocator *this_00;
  
  this_00 = *(ZoneAllocator **)(in_RDI + 8 + (ulong)in_ESI * 8);
  bVar1 = Block::empty((Block *)this_00);
  if (!bVar1) {
    DebugUtils::assertionFailed(in_stack_000003d0,in_stack_000003cc,in_stack_000003c0);
  }
  p = this_00->_slots[(ulong)((in_ESI != 0 ^ 0xffU) & 1) - 1];
  if (p == (Slot *)0x0) {
    if (*(ZoneAllocator **)(in_RDI + 8 + (ulong)((in_ESI != 0 ^ 0xffU) & 1) * 8) == this_00) {
      this_00->_slots[1] = (Slot *)((long)this_00->_slots + in_RDX + -8);
      this_00->_slots[2] = (Slot *)((long)this_00->_slots + in_RDX + -8);
    }
  }
  else {
    if ((ZoneAllocator *)p[in_ESI].next != this_00) {
      DebugUtils::assertionFailed(in_stack_000003d0,in_stack_000003cc,in_stack_000003c0);
    }
    ZoneAllocator::release(this_00,p,in_RDI);
    p[in_ESI].next = (Slot *)0x0;
    *(Slot **)(in_RDI + 8 + (ulong)in_ESI * 8) = p;
  }
  return;
}

Assistant:

void ZoneStackBase::_cleanupBlock(uint32_t side, size_t middleIndex) noexcept {
  Block* block = _block[side];
  ASMJIT_ASSERT(block->empty());

  Block* prev = block->_link[!side];
  if (prev) {
    ASMJIT_ASSERT(prev->_link[side] == block);
    _allocator->release(block, kBlockSize);

    prev->_link[side] = nullptr;
    _block[side] = prev;
  }
  else if (_block[!side] == block) {
    // If the container becomes empty center both pointers in the remaining block.
    block->_start = (uint8_t*)block + middleIndex;
    block->_end = (uint8_t*)block + middleIndex;
  }
}